

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddConfidentialTxOutput
              (void *handle,void *create_handle,int64_t value_satoshi,char *address,
              char *direct_locking_script,char *asset_string,char *nonce)

{
  undefined **ppuVar1;
  ConfidentialTransactionContext *this;
  bool bVar2;
  CfdException *pCVar3;
  Amount amount;
  ConfidentialAssetId asset;
  ConfidentialNonce nonce_obj;
  ElementsAddressFactory address_factory;
  ElementsConfidentialAddress confidential_addr;
  allocator local_2aa;
  bool local_2a9;
  void *local_2a8;
  Script local_2a0;
  Amount local_268;
  ConfidentialAssetId local_258;
  ConfidentialNonce local_230;
  AddressFactory local_208;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  pointer local_1b0;
  pointer local_198;
  pointer local_180;
  TapBranch local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_f0;
  Script local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98 [2];
  
  local_2a8 = handle;
  cfd::Initialize();
  ppuVar1 = (undefined **)(local_1e0 + 0x10);
  local_1e0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)local_1e0);
  if ((undefined **)local_1e0._0_8_ != ppuVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  local_2a9 = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&local_2a9);
  if (*(long *)((long)create_handle + 0x18) == 0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_1e0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_2a9 == true) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Invalid handle state. tx is bitcoin.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_1e0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Amount::Amount(&local_268,value_satoshi);
  this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  bVar2 = cfd::capi::IsEmptyString(asset_string);
  if (!bVar2) {
    std::__cxx11::string::string((string *)local_1e0,asset_string,(allocator *)&local_2a0);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_258,(string *)local_1e0);
    if ((undefined **)local_1e0._0_8_ != ppuVar1) {
      operator_delete((void *)local_1e0._0_8_);
    }
    cfd::core::ConfidentialNonce::ConfidentialNonce(&local_230);
    bVar2 = cfd::capi::IsEmptyString(nonce);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_2a0,nonce,(allocator *)&local_208);
      cfd::core::ConfidentialNonce::ConfidentialNonce
                ((ConfidentialNonce *)local_1e0,(string *)&local_2a0);
      cfd::core::ConfidentialNonce::operator=(&local_230,(ConfidentialNonce *)local_1e0);
      local_1e0._0_8_ = &PTR__ConfidentialNonce_00723710;
      if ((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
      }
      if (local_2a0._vptr_Script !=
          (_func_int **)
          &local_2a0.script_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(local_2a0._vptr_Script);
      }
    }
    bVar2 = cfd::capi::IsEmptyString(address);
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
      if (bVar2) {
        cfd::ConfidentialTransactionContext::UpdateFeeAmount(this,&local_268,&local_258);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_2a0,direct_locking_script,(allocator *)&local_208);
        cfd::core::Script::Script((Script *)local_1e0,(string *)&local_2a0);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (&this->super_ConfidentialTransaction,&local_268,&local_258,(Script *)local_1e0,
                   &local_230);
        cfd::core::Script::~Script((Script *)local_1e0);
        if (local_2a0._vptr_Script !=
            (_func_int **)
            &local_2a0.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(local_2a0._vptr_Script);
        }
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_208);
      std::__cxx11::string::string((string *)local_1e0,address,(allocator *)&local_2a0);
      bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_1e0);
      if ((undefined **)local_1e0._0_8_ != ppuVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_2a0,address,&local_2aa);
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_1e0,(string *)&local_2a0);
        if (local_2a0._vptr_Script !=
            (_func_int **)
            &local_2a0.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(local_2a0._vptr_Script);
        }
        (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
          [0x13])(this,local_1e0,&local_268,&local_258,0);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_1e0);
      }
      else {
        std::__cxx11::string::string((string *)&local_2a0,address,&local_2aa);
        cfd::AddressFactory::GetAddress((Address *)local_1e0,&local_208,(string *)&local_2a0);
        if (local_2a0._vptr_Script !=
            (_func_int **)
            &local_2a0.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(local_2a0._vptr_Script);
        }
        cfd::core::Address::GetLockingScript(&local_2a0,(Address *)local_1e0);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (&this->super_ConfidentialTransaction,&local_268,&local_258,&local_2a0,&local_230)
        ;
        cfd::core::Script::~Script(&local_2a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_98);
        cfd::core::Script::~Script(&local_d8);
        local_168._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_f0);
        cfd::core::TapBranch::~TapBranch(&local_168);
        if (local_180 != (pointer)0x0) {
          operator_delete(local_180);
        }
        if (local_198 != (pointer)0x0) {
          operator_delete(local_198);
        }
        if (local_1b0 != (pointer)0x0) {
          operator_delete(local_1b0);
        }
        if ((undefined1 *)local_1e0._16_8_ != local_1c0) {
          operator_delete((void *)local_1e0._16_8_);
        }
      }
      local_208._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_208.prefix_list_);
    }
    local_230._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
    if (local_230.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_230.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_258._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if (local_258.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_1e0._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_1e0._8_4_ = 0xa90;
  local_1e0._16_8_ = "CfdAddConfidentialTxOutput";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"asset is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1e0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,"Failed to parameter. asset is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1e0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxOutput(
    void* handle, void* create_handle, int64_t value_satoshi,
    const char* address, const char* direct_locking_script,
    const char* asset_string, const char* nonce) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }
    Amount amount = Amount(value_satoshi);

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }
    ConfidentialAssetId asset = ConfidentialAssetId(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(std::string(nonce));
    }

    if (!IsEmptyString(address)) {
      ElementsAddressFactory address_factory;
      if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
        ElementsConfidentialAddress confidential_addr(address);
        tx->AddTxOut(confidential_addr, amount, asset, false);
      } else {
        Address addr = address_factory.GetAddress(address);
        tx->AddTxOut(amount, asset, addr.GetLockingScript(), nonce_obj);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      tx->AddTxOut(amount, asset, Script(direct_locking_script), nonce_obj);
    } else {
      tx->UpdateFeeAmount(amount, asset);
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}